

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindowPrivate::updateActions(QMdiSubWindowPrivate *this)

{
  uint uVar1;
  int i;
  WindowStateAction action;
  
  uVar1 = *(uint *)(*(long *)(*(long *)&(this->super_QWidgetPrivate).field_0x8 + 0x20) + 0xc);
  action = RestoreAction;
  do {
    setVisible(this,action,false);
    action = action + MoveAction;
  } while (action != NumWindowStateActions);
  if ((uVar1 >> 0xb & 1) == 0) {
    setVisible(this,StayOnTopAction,true);
    setVisible(this,MoveAction,this->moveEnabled);
    setVisible(this,ResizeAction,this->resizeEnabled);
    if ((uVar1 >> 0xd & 1) != 0) {
      setVisible(this,CloseAction,true);
    }
    if ((uVar1 & 0xc000) != 0) {
      setVisible(this,RestoreAction,true);
    }
    if ((uVar1 >> 0xe & 1) != 0) {
      setVisible(this,MinimizeAction,true);
    }
    if ((short)uVar1 < 0) {
      setVisible(this,MaximizeAction,true);
      return;
    }
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::updateActions()
{
    Qt::WindowFlags windowFlags = q_func()->windowFlags();
    // Hide all
    for (int i = 0; i < NumWindowStateActions; ++i)
        setVisible(WindowStateAction(i), false);

#if defined(Q_OS_MACOS) && QT_CONFIG(action)
    if (q_func()->style()->inherits("QMacStyle"))
        for (int i = 0; i < NumWindowStateActions; ++i)
            if (QAction *action = actions[i])
                action->setIconVisibleInMenu(false);
#endif

    if (windowFlags & Qt::FramelessWindowHint)
        return;

    setVisible(StayOnTopAction, true);
    setVisible(MoveAction, moveEnabled);
    setVisible(ResizeAction, resizeEnabled);

    // CloseAction
    if (windowFlags & Qt::WindowSystemMenuHint)
        setVisible(CloseAction, true);

    // RestoreAction
    if (windowFlags & (Qt::WindowMinimizeButtonHint | Qt::WindowMaximizeButtonHint))
        setVisible(RestoreAction, true);

    // MinimizeAction
    if (windowFlags & Qt::WindowMinimizeButtonHint)
        setVisible(MinimizeAction, true);

    // MaximizeAction
    if (windowFlags & Qt::WindowMaximizeButtonHint)
        setVisible(MaximizeAction, true);
}